

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O2

void __thiscall
xmrig::JobResultsPrivate::submit(JobResultsPrivate *this,Job *job,uint32_t *results,size_t count)

{
  size_t local_38;
  uint32_t *local_30;
  
  local_38 = count;
  local_30 = results;
  std::mutex::lock(&this->m_mutex);
  std::__cxx11::list<xmrig::JobBundle,std::allocator<xmrig::JobBundle>>::
  emplace_back<xmrig::Job_const&,unsigned_int*&,unsigned_long&>
            ((list<xmrig::JobBundle,std::allocator<xmrig::JobBundle>> *)&this->m_bundles,job,
             &local_30,&local_38);
  uv_async_send(this->m_async);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

inline void submit(const Job &job, uint32_t *results, size_t count)
    {
        std::lock_guard<std::mutex> lock(m_mutex);
        m_bundles.emplace_back(job, results, count);

        uv_async_send(m_async);
    }